

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.h
# Opt level: O3

ProString * __thiscall
ProString::operator=
          (ProString *this,
          QStringBuilder<QStringBuilder<const_char_(&)[2],_ProString_&>,_const_char_(&)[2]> *str)

{
  long in_FS_OFFSET;
  QString local_68;
  ProString local_50;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QStringBuilder<QStringBuilder<const_char_(&)[2],_ProString_&>,_const_char_(&)[2]>::
  convertTo<QString>(&local_68,str);
  ProString(&local_50,&local_68);
  QString::operator=(&this->m_string,(QString *)&local_50);
  this->m_hash = local_50.m_hash;
  this->m_offset = local_50.m_offset;
  this->m_length = local_50.m_length;
  this->m_file = local_50.m_file;
  *(undefined4 *)&this->field_0x24 = local_50._36_4_;
  if (&(local_50.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_50.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_50.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

ProString &operator=(const QStringBuilder<A, B> &str)
    { return *this = QString(str); }